

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps2raster.cpp
# Opt level: O1

int32 rw::ps2::getRasterFormat(Raster *raster)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int32 iVar4;
  uint uVar5;
  
  iVar2 = cameraZDepth;
  if ((uint)raster->type < 6) {
    uVar1 = raster->format;
    uVar5 = uVar1 & 0xf00;
    switch(raster->type) {
    default:
      if ((uVar1 & 0xf000) == 0) goto switchD_00128ddb_caseD_4;
      getRasterFormat();
      break;
    case 1:
      if ((uVar1 & 0xf000) == 0) {
        if (raster->depth == cameraZDepth || raster->depth == 0) {
          raster->depth = cameraZDepth;
          if ((uVar5 == 0) ||
             ((iVar2 != 0x10 || uVar5 == 0x700 && (uVar5 == 0x900 || iVar2 != 0x20)))) {
            raster->format = (uint)(iVar2 != 0x10) * 0x200 + 0x700;
            return 1;
          }
          getRasterFormat();
        }
        else {
          getRasterFormat();
        }
      }
      else {
        getRasterFormat();
      }
      break;
    case 2:
      if ((uVar1 & 0xf000) == 0) {
        if (raster->depth == cameraDepth || raster->depth == 0) {
          raster->depth = cameraDepth;
          if (uVar5 == cameraFormat || uVar5 == 0) {
            raster->format = cameraFormat;
            return 1;
          }
          getRasterFormat();
        }
        else {
          getRasterFormat();
        }
      }
      else {
        getRasterFormat();
      }
      break;
    case 3:
      goto switchD_00128ddb_caseD_3;
    case 4:
switchD_00128ddb_caseD_4:
      if (uVar5 == 0) {
        uVar5 = raster->depth << 0x1e | raster->depth - 4U >> 2;
        if (uVar5 < 8) {
          uVar3 = *(uint *)(&DAT_00137d30 + (ulong)uVar5 * 4);
          uVar5 = *(uint *)(&DAT_00137d50 + (ulong)uVar5 * 4);
        }
        else {
          uVar5 = 0x100;
          uVar3 = 0;
        }
      }
      else {
        uVar3 = uVar1 & 0x6000;
      }
      raster->format = uVar1 & 0x9000 | uVar3 | uVar5;
      iVar4 = (*(code *)((long)&DAT_00137908 + (long)(int)(&DAT_00137908)[uVar3 >> 0xd]))();
      return iVar4;
    }
  }
  else {
switchD_00128ddb_caseD_3:
    getRasterFormat();
  }
  return 0;
}

Assistant:

int32
getRasterFormat(Raster *raster)
{
	int32 palformat, pixelformat, mipmapflags;
	pixelformat = raster->format & 0xF00;
	palformat = raster->format & 0x6000;
	mipmapflags = raster->format & 0x9000;
	switch(raster->type){
	case Raster::ZBUFFER:
		if(palformat || mipmapflags){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		if(raster->depth && raster->depth != cameraZDepth){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		raster->depth = cameraZDepth;
		if(pixelformat){
			if((raster->depth == 16 && pixelformat != Raster::D16) ||
			   (raster->depth == 32 && pixelformat != Raster::D32)){
				RWERROR((ERR_INVRASTER));
				return 0;
			}
		}
		pixelformat = raster->depth == 16 ? Raster::D16 : Raster::D32;
		raster->format = pixelformat;
		break;
	case Raster::CAMERA:
		if(palformat || mipmapflags){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		if(raster->depth && raster->depth != cameraDepth){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		raster->depth = cameraDepth;
		if(pixelformat && pixelformat != cameraFormat){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		pixelformat = cameraFormat;
		raster->format = pixelformat;
		break;
	case Raster::NORMAL:
	case Raster::CAMERATEXTURE:
		if(palformat || mipmapflags){
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		/* fallthrough */
	case Raster::TEXTURE:
		// Find raster format by depth if none was given
		if(pixelformat == 0)
			switch(raster->depth){
			case 4:
				pixelformat = Raster::C1555;
				palformat = Raster::PAL4;
				break;
			case 8:
				pixelformat = Raster::C1555;
				palformat = Raster::PAL8;
				break;
			case 24:
			// unsafe
			//	pixelformat = Raster::C888;
			//	palformat = 0;
			//	break;
			case 32:
				pixelformat = Raster::C8888;
				palformat = 0;
				break;
			default:
				pixelformat = Raster::C1555;
				palformat = 0;
				break;
			}
		raster->format = pixelformat | palformat | mipmapflags;
		// Sanity check raster format and depth; set depth if none given
		if(palformat){
			if(palformat == Raster::PAL8){
				if(raster->depth && raster->depth != 8){
					RWERROR((ERR_INVRASTER));
					return 0;
				}
				raster->depth = 8;
				if(pixelformat != Raster::C1555 && pixelformat != Raster::C8888){
					RWERROR((ERR_INVRASTER));
					return 0;
				}
			}else if(palformat == Raster::PAL4){
				if(raster->depth && raster->depth != 4){
					RWERROR((ERR_INVRASTER));
					return 0;
				}
				raster->depth = 4;
				if(pixelformat != Raster::C1555 && pixelformat != Raster::C8888){
					RWERROR((ERR_INVRASTER));
					return 0;
				}
			}else{
				RWERROR((ERR_INVRASTER));
				return 0;
			}
		}else if(pixelformat == Raster::C1555){
			if(raster->depth && raster->depth != 16){
				RWERROR((ERR_INVRASTER));
				return 0;
			}
			raster->depth = 16;
		}else if(pixelformat == Raster::C8888){
			if(raster->depth && raster->depth != 32){
				RWERROR((ERR_INVRASTER));
				return 0;
			}
			raster->depth = 32;
		}else if(pixelformat == Raster::C888){
			assert(0 && "24 bit rasters not supported");
			if(raster->depth && raster->depth != 24){
				RWERROR((ERR_INVRASTER));
				return 0;
			}
			raster->depth = 24;
		}else{
			RWERROR((ERR_INVRASTER));
			return 0;
		}
		break;
	default:
		RWERROR((ERR_INVRASTER));
		return 0;
	}
	return 1;
}